

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall glslang::TParseContext::setPrecisionDefaults(TParseContext *this)

{
  bool bVar1;
  int iVar2;
  int local_20;
  TSampler local_1c;
  int type_2;
  TSampler sampler;
  int type_1;
  int type;
  TParseContext *this_local;
  
  for (sampler = (TSampler)0x0; (int)sampler < 0x1c; sampler = (TSampler)((int)sampler + 1)) {
    this->defaultPrecision[(int)sampler] = EpqNone;
  }
  for (type_2 = 0; type_2 < 0x1f80; type_2 = type_2 + 1) {
    this->defaultSamplerPrecision[type_2] = EpqNone;
  }
  bVar1 = obeyPrecisionQualifiers(this);
  if (bVar1) {
    bVar1 = TParseVersions::isEsProfile((TParseVersions *)this);
    if (bVar1) {
      TSampler::set(&local_1c,EbtFloat,Esd2D,false,false,false);
      iVar2 = computeSamplerTypeIndex(this,&local_1c);
      this->defaultSamplerPrecision[iVar2] = EpqLow;
      TSampler::set(&local_1c,EbtFloat,EsdCube,false,false,false);
      iVar2 = computeSamplerTypeIndex(this,&local_1c);
      this->defaultSamplerPrecision[iVar2] = EpqLow;
      TSampler::set(&local_1c,EbtFloat,Esd2D,false,false,false);
      TSampler::setExternal(&local_1c,true);
      iVar2 = computeSamplerTypeIndex(this,&local_1c);
      this->defaultSamplerPrecision[iVar2] = EpqLow;
    }
    if (((this->super_TParseContextBase).parsingBuiltins & 1U) == 0) {
      bVar1 = TParseVersions::isEsProfile((TParseVersions *)this);
      if ((bVar1) &&
         ((this->super_TParseContextBase).super_TParseVersions.language == EShLangFragment)) {
        this->defaultPrecision[8] = EpqMedium;
        this->defaultPrecision[9] = EpqMedium;
      }
      else {
        this->defaultPrecision[8] = EpqHigh;
        this->defaultPrecision[9] = EpqHigh;
        this->defaultPrecision[1] = EpqHigh;
      }
      bVar1 = TParseVersions::isEsProfile((TParseVersions *)this);
      if (!bVar1) {
        for (local_20 = 0; local_20 < 0x1f80; local_20 = local_20 + 1) {
          this->defaultSamplerPrecision[local_20] = EpqHigh;
        }
      }
    }
    this->defaultPrecision[0xe] = EpqLow;
    this->defaultPrecision[0xd] = EpqHigh;
  }
  return;
}

Assistant:

void TParseContext::setPrecisionDefaults()
{
    // Set all precision defaults to EpqNone, which is correct for all types
    // when not obeying precision qualifiers, and correct for types that don't
    // have defaults (thus getting an error on use) when obeying precision
    // qualifiers.

    for (int type = 0; type < EbtNumTypes; ++type)
        defaultPrecision[type] = EpqNone;

    for (int type = 0; type < maxSamplerIndex; ++type)
        defaultSamplerPrecision[type] = EpqNone;

    // replace with real precision defaults for those that have them
    if (obeyPrecisionQualifiers()) {
        if (isEsProfile()) {
            // Most don't have defaults, a few default to lowp.
            TSampler sampler;
            sampler.set(EbtFloat, Esd2D);
            defaultSamplerPrecision[computeSamplerTypeIndex(sampler)] = EpqLow;
            sampler.set(EbtFloat, EsdCube);
            defaultSamplerPrecision[computeSamplerTypeIndex(sampler)] = EpqLow;
            sampler.set(EbtFloat, Esd2D);
            sampler.setExternal(true);
            defaultSamplerPrecision[computeSamplerTypeIndex(sampler)] = EpqLow;
        }

        // If we are parsing built-in computational variables/functions, it is meaningful to record
        // whether the built-in has no precision qualifier, as that ambiguity
        // is used to resolve the precision from the supplied arguments/operands instead.
        // So, we don't actually want to replace EpqNone with a default precision for built-ins.
        if (! parsingBuiltins) {
            if (isEsProfile() && language == EShLangFragment) {
                defaultPrecision[EbtInt] = EpqMedium;
                defaultPrecision[EbtUint] = EpqMedium;
            } else {
                defaultPrecision[EbtInt] = EpqHigh;
                defaultPrecision[EbtUint] = EpqHigh;
                defaultPrecision[EbtFloat] = EpqHigh;
            }

            if (!isEsProfile()) {
                // Non-ES profile
                // All sampler precisions default to highp.
                for (int type = 0; type < maxSamplerIndex; ++type)
                    defaultSamplerPrecision[type] = EpqHigh;
            }
        }

        defaultPrecision[EbtSampler] = EpqLow;
        defaultPrecision[EbtAtomicUint] = EpqHigh;
    }
}